

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int dom_trans_func(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  byte bVar1;
  MIR_item_t pMVar2;
  gen_ctx_t pgVar3;
  bitmap_el_t *pbVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  gen_ctx_t pgVar6;
  ulong *extraout_RDX;
  MIR_context_t pMVar7;
  ulong *extraout_RDX_00;
  char *pcVar8;
  gen_ctx_t unaff_RBX;
  gen_ctx_t pgVar9;
  gen_ctx_t bm;
  MIR_context_t unaff_RBP;
  gen_ctx_t pgVar10;
  bb_t_conflict nb;
  bb_t_conflict pbVar11;
  char *pcVar12;
  gen_ctx_t pgVar13;
  bitmap_el_t bVar14;
  MIR_context_t pMVar15;
  ulong uVar16;
  bitmap_t pVVar17;
  ulong *puVar18;
  MIR_context_t unaff_R12;
  MIR_context_t unaff_R13;
  ulong *unaff_R14;
  bb_t_conflict pbVar19;
  undefined8 uVar20;
  
  pbVar11 = (bb_t_conflict)gen_ctx->temp_bitmap;
  if ((pbVar11 != (bb_t_conflict)0x0) && ((bitmap_el_t *)pbVar11->rpost != (bitmap_el_t *)0x0)) {
    pbVar11->index = 0;
    uVar16 = bb->index;
    bitmap_expand((bitmap_t)pbVar11,uVar16 + 1);
    ((bitmap_el_t *)pbVar11->rpost)[uVar16 >> 6] =
         ((bitmap_el_t *)pbVar11->rpost)[uVar16 >> 6] | 1L << (uVar16 & 0x3f);
    iVar5 = bitmap_ior(bb->dom_out,bb->dom_in,gen_ctx->temp_bitmap);
    return iVar5;
  }
  dom_trans_func_cold_1();
  nb = bb;
  bm = gen_ctx;
  if (bb == (bb_t_conflict)0x0) {
LAB_00167d17:
    bitmap_ior_cold_4();
LAB_00167d1c:
    bb = pbVar11;
    gen_ctx = unaff_RBX;
    bitmap_ior_cold_3();
  }
  else {
    unaff_R14 = extraout_RDX;
    if (extraout_RDX == (ulong *)0x0) goto LAB_00167d1c;
    unaff_R12 = (MIR_context_t)bb->index;
    unaff_R13 = (MIR_context_t)*extraout_RDX;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (bb_t_conflict)((long)unaff_RBP << 6);
    bitmap_expand((bitmap_t)gen_ctx,(size_t)nb);
    if (gen_ctx != (gen_ctx_t)0x0) {
      pMVar2 = gen_ctx->curr_func_item;
      if (unaff_RBP == (MIR_context_t)0x0) {
        pMVar7 = (MIR_context_t)0x0;
        iVar5 = 0;
      }
      else {
        nb = (bb_t_conflict)bb->rpost;
        bm = (gen_ctx_t)extraout_RDX[2];
        iVar5 = 0;
        pMVar15 = (MIR_context_t)0x0;
        pMVar7 = (MIR_context_t)0x0;
        do {
          if (pMVar15 < unaff_R12) {
            bVar14 = (&nb->index)[(long)pMVar15];
          }
          else {
            bVar14 = 0;
          }
          if (pMVar15 < unaff_R13) {
            pVVar17 = bm->call_used_hard_regs[(long)((long)&pMVar15[-1].setjmp_addr + 3)];
          }
          else {
            pVVar17 = (bitmap_t)0x0;
          }
          unaff_R14 = (ulong *)(&pMVar2->data)[(long)pMVar15];
          puVar18 = (ulong *)((ulong)pVVar17 | bVar14);
          (&pMVar2->data)[(long)pMVar15] = puVar18;
          pMVar15 = (MIR_context_t)((long)&pMVar15->gen_ctx + 1);
          if (puVar18 != (ulong *)0x0) {
            pMVar7 = pMVar15;
          }
          if (unaff_R14 != puVar18) {
            iVar5 = 1;
          }
        } while (unaff_RBP != pMVar15);
      }
      if ((pMVar2 != (MIR_item_t)0x0) && (pMVar7 <= gen_ctx->ctx)) {
        gen_ctx->ctx = pMVar7;
        return iVar5;
      }
      bitmap_ior_cold_1();
      unaff_RBX = gen_ctx;
      pbVar11 = bb;
      goto LAB_00167d17;
    }
  }
  bitmap_ior_cold_2();
  pgVar9 = gen_ctx;
  pbVar11 = nb;
  pgVar13 = bm;
  puVar18 = unaff_R14;
  pbVar19 = bb;
  uVar20 = extraout_RAX;
  if (nb == (bb_t_conflict)0x0) {
LAB_00167ddf:
    bitmap_and_compl_cold_4();
  }
  else {
    puVar18 = extraout_RDX_00;
    if (extraout_RDX_00 != (ulong *)0x0) {
      pgVar9 = (gen_ctx_t)nb->index;
      pgVar3 = (gen_ctx_t)*extraout_RDX_00;
      pgVar10 = pgVar3;
      if (pgVar3 < pgVar9) {
        pgVar10 = pgVar9;
      }
      pbVar11 = (bb_t_conflict)((long)pgVar10 << 6);
      bitmap_expand((bitmap_t)bm,(size_t)pbVar11);
      if (bm == (gen_ctx_t)0x0) goto LAB_00167de9;
      pMVar2 = bm->curr_func_item;
      if (pgVar10 == (gen_ctx_t)0x0) {
        pgVar6 = (gen_ctx_t)0x0;
      }
      else {
        pbVar4 = (bitmap_el_t *)nb->rpost;
        pbVar11 = (bb_t_conflict)extraout_RDX_00[2];
        pgVar13 = (gen_ctx_t)0x0;
        pgVar6 = (gen_ctx_t)0x0;
        do {
          if (pgVar13 < pgVar9) {
            bVar14 = pbVar4[(long)pgVar13];
          }
          else {
            bVar14 = 0;
          }
          uVar16 = 0xffffffffffffffff;
          if (pgVar13 < pgVar3) {
            uVar16 = ~(&pbVar11->index)[(long)pgVar13];
          }
          (&pMVar2->data)[(long)pgVar13] = (void *)(uVar16 & bVar14);
          pgVar13 = (gen_ctx_t)((long)&pgVar13->ctx + 1);
          if ((void *)(uVar16 & bVar14) != (void *)0x0) {
            pgVar6 = pgVar13;
          }
        } while (pgVar10 != pgVar13);
      }
      if ((pMVar2 != (MIR_item_t)0x0) && (pgVar6 <= (gen_ctx_t)bm->ctx)) {
        bm->ctx = (MIR_context_t)pgVar6;
        return (int)pMVar2;
      }
      bitmap_and_compl_cold_1();
      pgVar9 = bm;
      pbVar19 = nb;
      goto LAB_00167ddf;
    }
  }
  nb = pbVar19;
  bm = pgVar9;
  bitmap_and_compl_cold_3();
LAB_00167de9:
  bitmap_and_compl_cold_2();
  if (((FILE *)pgVar13->debug_file != (FILE *)0x0) && (1 < pgVar13->debug_level)) {
    pMVar7 = pgVar13->ctx;
    bVar1 = *(byte *)((long)&pbVar11->pre + 1);
    pcVar12 = "may/must alloca ";
    if ((bVar1 & 3) == 0) {
      pcVar12 = "must alloca";
    }
    pcVar8 = "";
    if (bVar1 != 0) {
      pcVar8 = pcVar12;
    }
    pcVar12 = "const val";
    if ((char)pbVar11->pre == '\0') {
      pcVar12 = "val";
    }
    fprintf((FILE *)pgVar13->debug_file,"%s%s=%lld for insn %lu:",pcVar8,pcVar12,pbVar11->bfs,
            (ulong)*(uint *)((long)&pbVar11->pre + 4),bm,puVar18,nb,uVar20,gen_ctx,unaff_R12,
            unaff_R13,unaff_R14,bb,unaff_RBP);
    MIR_output_insn(pMVar7,pgVar13->debug_file,(MIR_insn_t_conflict)pbVar11->index,
                    (pgVar13->curr_func_item->u).func,1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static int dom_trans_func (gen_ctx_t gen_ctx, bb_t bb) {
  bitmap_clear (temp_bitmap);
  bitmap_set_bit_p (temp_bitmap, bb->index);
  return bitmap_ior (bb->dom_out, bb->dom_in, temp_bitmap);
}